

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintTo(__uint128_t v,ostream *os)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ostream *in_RDX;
  ulong uVar3;
  ulong in_RSI;
  ulong in_RDI;
  char digit;
  uint64_t carry;
  uint64_t high_mod;
  uint64_t low;
  uint64_t high;
  char *p;
  char buf [40];
  ulong local_70;
  ulong local_68;
  char *local_60;
  char local_32 [50];
  
  if (in_RDI == 0 && in_RSI == 0) {
    std::operator<<(in_RDX,"0");
  }
  else {
    local_32[1] = 0;
    local_68 = in_RSI;
    local_60 = local_32 + 1;
    for (local_70 = in_RDI; local_68 != 0 || local_70 != 0;
        local_70 = local_70 / 10 + uVar3 * 0x1999999999999999 + uVar2 / 10) {
      uVar3 = local_68 % 10;
      local_68 = local_68 / 10;
      uVar2 = uVar3 * 6 + local_70 % 10;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar2;
      local_60[-1] = SUB161(auVar1 % ZEXT816(10),0) + '0';
      local_60 = local_60 + -1;
    }
    std::operator<<(in_RDX,local_60);
  }
  return;
}

Assistant:

void PrintTo(__uint128_t v, ::std::ostream* os) {
  if (v == 0) {
    *os << "0";
    return;
  }

  // Buffer large enough for ceil(log10(2^128))==39 and the null terminator
  char buf[40];
  char* p = buf + sizeof(buf);

  // Some configurations have a __uint128_t, but no support for built in
  // division. Do manual long division instead.

  uint64_t high = static_cast<uint64_t>(v >> 64);
  uint64_t low = static_cast<uint64_t>(v);

  *--p = 0;
  while (high != 0 || low != 0) {
    uint64_t high_mod = high % 10;
    high = high / 10;
    // This is the long division algorithm specialized for a divisor of 10 and
    // only two elements.
    // Notable values:
    //   2^64 / 10 == 1844674407370955161
    //   2^64 % 10 == 6
    const uint64_t carry = 6 * high_mod + low % 10;
    low = low / 10 + high_mod * 1844674407370955161 + carry / 10;

    char digit = static_cast<char>(carry % 10);
    *--p = static_cast<char>('0' + digit);
  }
  *os << p;
}